

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void UnionRectWithRegion(QRect *rect,QRegionPrivate *source,QRegionPrivate *dest)

{
  long lVar1;
  bool bVar2;
  QRegionPrivate *in_RDX;
  QRegionPrivate *in_RSI;
  QRegionPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegionPrivate p;
  QRegionPrivate *in_stack_ffffffffffffff58;
  QRegionPrivate *in_stack_ffffffffffffff78;
  QRect *in_stack_ffffffffffffff80;
  QRegionPrivate *in_stack_ffffffffffffff88;
  QRect *in_stack_ffffffffffffffb0;
  QRegionPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRect::isEmpty((QRect *)in_RDX);
  if (!bVar2) {
    if (((Representation *)&in_RDX->numRects)->m_i == 0) {
      QRegionPrivate::QRegionPrivate(in_RDI,(QRect *)in_RSI);
      QRegionPrivate::operator=(in_RDX,in_stack_ffffffffffffff58);
      QRegionPrivate::~QRegionPrivate((QRegionPrivate *)0x653fce);
    }
    else {
      bVar2 = QRegionPrivate::canAppend(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (bVar2) {
        QRegionPrivate::append(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        memset(&stack0xffffffffffffff78,0xaa,0x40);
        QRegionPrivate::QRegionPrivate(in_RDI,(QRect *)in_RSI);
        UnionRegion(in_stack_ffffffffffffff78,in_RDI,in_RSI);
        QRegionPrivate::~QRegionPrivate((QRegionPrivate *)0x654037);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void UnionRectWithRegion(const QRect *rect, const QRegionPrivate *source,
                                QRegionPrivate &dest)
{
    if (rect->isEmpty())
        return;

    Q_ASSERT(EqualRegion(source, &dest));

    if (dest.numRects == 0) {
        dest = QRegionPrivate(*rect);
    } else if (dest.canAppend(rect)) {
        dest.append(rect);
    } else {
        QRegionPrivate p(*rect);
        UnionRegion(&p, source, dest);
    }
}